

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::AddDefineFlag(cmMakefile *this,string *flag)

{
  bool bVar1;
  
  if (flag->_M_string_length != 0) {
    s_AddDefineFlag(flag,&this->DefineFlagsOrig);
    bVar1 = ParseDefineFlag(this,flag,false);
    if (!bVar1) {
      s_AddDefineFlag(flag,&this->DefineFlags);
      return;
    }
  }
  return;
}

Assistant:

void cmMakefile::UpdateOutputToSourceMap(std::string const& output,
                                         cmSourceFile* source)
{
  OutputToSourceMap::iterator i = this->OutputToSource.find(output);
  if (i != this->OutputToSource.end()) {
    // Multiple custom commands produce the same output but may
    // be attached to a different source file (MAIN_DEPENDENCY).
    // LinearGetSourceFileWithOutput would return the first one,
    // so keep the mapping for the first one.
    //
    // TODO: Warn the user about this case.  However, the VS 8 generator
    // triggers it for separate generate.stamp rules in ZERO_CHECK and
    // individual targets.
    return;
  }
  this->OutputToSource[output] = source;
}